

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mojoshader_compiler.c
# Opt level: O2

void * build_ir_internal(Context_conflict *ctx,void *_ast)

{
  double dVar1;
  char cVar2;
  uint index;
  MOJOSHADER_astNodeType MVar3;
  undefined4 uVar4;
  MOJOSHADER_irNodeType MVar5;
  int iVar6;
  int iVar7;
  MOJOSHADER_irStatement *pMVar8;
  MOJOSHADER_irStatement *pMVar9;
  MOJOSHADER_irExpression *pMVar10;
  MOJOSHADER_irExpression *fval;
  undefined4 *puVar11;
  MOJOSHADER_irExprList *pMVar12;
  MOJOSHADER_astDataType *pMVar13;
  MOJOSHADER_astDataType *pMVar14;
  MOJOSHADER_irExpression *pMVar15;
  MOJOSHADER_irExpression *pMVar16;
  MOJOSHADER_irStatement *pMVar17;
  MOJOSHADER_irStatement *next;
  LoopLabels *pLVar18;
  MOJOSHADER_irStatement *pMVar19;
  MOJOSHADER_irStatement *pMVar20;
  MOJOSHADER_irStatement *pMVar21;
  MOJOSHADER_irStatement *pMVar22;
  long lVar23;
  MOJOSHADER_irBinOpType MVar24;
  int iVar25;
  undefined1 uVar26;
  MOJOSHADER_astExpression *pMVar27;
  MOJOSHADER_astDataTypeType MVar28;
  MOJOSHADER_irConditionType MStack_80;
  MOJOSHADER_irStatement *local_78;
  int local_54;
  MOJOSHADER_irStatement *local_50;
  MOJOSHADER_astDataTypeType local_44;
  MOJOSHADER_irStatement *local_40;
  ulong local_38;
  
LAB_0012f154:
  if ((MOJOSHADER_astExpressionBinary *)_ast == (MOJOSHADER_astExpressionBinary *)0x0) {
    return (void *)0x0;
  }
  if (ctx->out_of_memory != 0) {
    return (void *)0x0;
  }
  ctx->sourcefile = *(char **)((long)_ast + 8);
  ctx->sourceline = *(uint *)((long)_ast + 0x10);
  switch(*_ast) {
  case 2:
    MVar24 = MOJOSHADER_IR_BINOP_ADD;
    goto LAB_0012fb72;
  case 3:
    MVar24 = MOJOSHADER_IR_BINOP_SUBTRACT;
LAB_0012fb72:
    pMVar15 = build_ir_preincdec(ctx,(MOJOSHADER_astExpressionUnary *)_ast,MVar24);
    return pMVar15;
  case 4:
    pMVar15 = build_ir_increxpr(ctx,*(MOJOSHADER_astDataType **)
                                     &((MOJOSHADER_astDataTypeFunction *)_ast)->num_params,-1);
    pMVar27 = *(MOJOSHADER_astExpression **)((long)_ast + 0x20);
    goto LAB_0012fbc8;
  case 5:
    pMVar15 = build_ir_expr(ctx,*(void **)((long)_ast + 0x20));
    iVar6 = -1;
    goto LAB_0012faba;
  case 6:
    if (**(int **)((long)*(void **)((long)_ast + 0x20) + 0x18) != 1) {
      __assert_fail("ast->unary.operand->datatype->type == MOJOSHADER_AST_DATATYPE_BOOL",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/andburn[P]mojoshader/mojoshader_compiler.c"
                    ,0x155b,"void *build_ir_internal(Context *, void *)");
    }
    pMVar15 = build_ir_expr(ctx,*(void **)((long)_ast + 0x20));
    iVar6 = 1;
LAB_0012faba:
    pMVar16 = new_ir_constint(ctx,iVar6);
    MStack_80 = MOJOSHADER_IR_BINOP_XOR;
    break;
  case 7:
    MVar24 = MOJOSHADER_IR_BINOP_ADD;
    goto LAB_0012f8a2;
  case 8:
    MVar24 = MOJOSHADER_IR_BINOP_SUBTRACT;
LAB_0012f8a2:
    pMVar15 = build_ir_postincdec(ctx,(MOJOSHADER_astExpressionUnary *)_ast,MVar24);
    return pMVar15;
  case 9:
    pMVar13 = reduce_datatype(ctx,*(MOJOSHADER_astDataType **)
                                   &((MOJOSHADER_astDataTypeFunction *)_ast)->num_params);
    pMVar14 = datatype_base(ctx,pMVar13);
    MVar28 = pMVar14->type;
    iVar6 = datatype_elems(ctx,pMVar13);
    pMVar15 = build_ir_expr(ctx,*(void **)((long)_ast + 0x20));
    puVar11 = (undefined4 *)Malloc(ctx,0x28);
    if (puVar11 == (undefined4 *)0x0) {
      return (void *)0x0;
    }
    *puVar11 = 8;
    goto LAB_0012fca4;
  default:
    __assert_fail("0 && \"unexpected type\"",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/andburn[P]mojoshader/mojoshader_compiler.c"
                  ,0x1607,"void *build_ir_internal(Context *, void *)");
  case 0xc:
    pMVar15 = build_ir_expr(ctx,*(void **)((long)_ast + 0x20));
    pMVar17 = new_ir_expr_stmt(ctx,pMVar15);
    pMVar15 = build_ir_expr(ctx,*(MOJOSHADER_astExpression **)((long)_ast + 0x28));
    goto LAB_0012fd77;
  case 0xd:
    pMVar15 = build_ir_expr(ctx,*(void **)((long)_ast + 0x20));
    pMVar16 = build_ir_expr(ctx,*(MOJOSHADER_astExpression **)((long)_ast + 0x28));
    MStack_80 = MOJOSHADER_IR_BINOP_MULTIPLY;
    break;
  case 0xe:
    pMVar15 = build_ir_expr(ctx,*(void **)((long)_ast + 0x20));
    pMVar16 = build_ir_expr(ctx,*(MOJOSHADER_astExpression **)((long)_ast + 0x28));
    MStack_80 = MOJOSHADER_IR_BINOP_DIVIDE;
    break;
  case 0xf:
    pMVar15 = build_ir_expr(ctx,*(void **)((long)_ast + 0x20));
    pMVar16 = build_ir_expr(ctx,*(MOJOSHADER_astExpression **)((long)_ast + 0x28));
    MStack_80 = MOJOSHADER_IR_BINOP_MODULO;
    break;
  case 0x10:
    pMVar15 = build_ir_expr(ctx,*(void **)((long)_ast + 0x20));
    pMVar16 = build_ir_expr(ctx,*(MOJOSHADER_astExpression **)((long)_ast + 0x28));
    MStack_80 = MOJOSHADER_IR_BINOP_ADD;
    break;
  case 0x11:
    pMVar15 = build_ir_expr(ctx,*(void **)((long)_ast + 0x20));
    pMVar27 = *(MOJOSHADER_astExpression **)((long)_ast + 0x28);
LAB_0012fbc8:
    pMVar16 = build_ir_expr(ctx,pMVar27);
    MStack_80 = MOJOSHADER_IR_BINOP_SUBTRACT;
    break;
  case 0x12:
    pMVar15 = build_ir_expr(ctx,*(void **)((long)_ast + 0x20));
    pMVar16 = build_ir_expr(ctx,*(MOJOSHADER_astExpression **)((long)_ast + 0x28));
    MStack_80 = MOJOSHADER_IR_BINOP_LSHIFT;
    break;
  case 0x13:
    pMVar15 = build_ir_expr(ctx,*(void **)((long)_ast + 0x20));
    pMVar16 = build_ir_expr(ctx,*(MOJOSHADER_astExpression **)((long)_ast + 0x28));
    MStack_80 = MOJOSHADER_IR_BINOP_RSHIFT;
    break;
  case 0x14:
    pMVar15 = build_ir_expr(ctx,*(void **)((long)_ast + 0x20));
    pMVar16 = build_ir_expr(ctx,*(MOJOSHADER_astExpression **)((long)_ast + 0x28));
    pMVar10 = new_ir_constbool(ctx,1);
    fval = new_ir_constbool(ctx,0);
    MStack_80 = MOJOSHADER_IR_COND_LT;
    goto LAB_0012fb53;
  case 0x15:
    pMVar15 = build_ir_expr(ctx,*(void **)((long)_ast + 0x20));
    pMVar16 = build_ir_expr(ctx,*(MOJOSHADER_astExpression **)((long)_ast + 0x28));
    pMVar10 = new_ir_constbool(ctx,1);
    fval = new_ir_constbool(ctx,0);
    MStack_80 = MOJOSHADER_IR_COND_GT;
    goto LAB_0012fb53;
  case 0x16:
    pMVar15 = build_ir_expr(ctx,*(void **)((long)_ast + 0x20));
    pMVar16 = build_ir_expr(ctx,*(MOJOSHADER_astExpression **)((long)_ast + 0x28));
    pMVar10 = new_ir_constbool(ctx,1);
    fval = new_ir_constbool(ctx,0);
    MStack_80 = MOJOSHADER_IR_COND_LEQ;
    goto LAB_0012fb53;
  case 0x17:
    pMVar15 = build_ir_expr(ctx,*(void **)((long)_ast + 0x20));
    pMVar16 = build_ir_expr(ctx,*(MOJOSHADER_astExpression **)((long)_ast + 0x28));
    pMVar10 = new_ir_constbool(ctx,1);
    fval = new_ir_constbool(ctx,0);
    MStack_80 = MOJOSHADER_IR_COND_GEQ;
    goto LAB_0012fb53;
  case 0x18:
    pMVar15 = build_ir_expr(ctx,*(void **)((long)_ast + 0x20));
    pMVar16 = build_ir_expr(ctx,*(MOJOSHADER_astExpression **)((long)_ast + 0x28));
    pMVar10 = new_ir_constbool(ctx,1);
    fval = new_ir_constbool(ctx,0);
    MStack_80 = MOJOSHADER_IR_COND_EQL;
    goto LAB_0012fb53;
  case 0x19:
    pMVar15 = build_ir_expr(ctx,*(void **)((long)_ast + 0x20));
    pMVar16 = build_ir_expr(ctx,*(MOJOSHADER_astExpression **)((long)_ast + 0x28));
    MStack_80 = MOJOSHADER_IR_COND_NEQ;
    pMVar10 = new_ir_constbool(ctx,1);
    fval = new_ir_constbool(ctx,0);
    goto LAB_0012fb53;
  case 0x1a:
    pMVar15 = build_ir_expr(ctx,*(void **)((long)_ast + 0x20));
    pMVar16 = build_ir_expr(ctx,*(MOJOSHADER_astExpression **)((long)_ast + 0x28));
    MStack_80 = MOJOSHADER_IR_BINOP_AND;
    break;
  case 0x1b:
    pMVar15 = build_ir_expr(ctx,*(void **)((long)_ast + 0x20));
    pMVar16 = build_ir_expr(ctx,*(MOJOSHADER_astExpression **)((long)_ast + 0x28));
    MStack_80 = MOJOSHADER_IR_BINOP_XOR;
    break;
  case 0x1c:
    pMVar15 = build_ir_expr(ctx,*(void **)((long)_ast + 0x20));
    pMVar16 = build_ir_expr(ctx,*(MOJOSHADER_astExpression **)((long)_ast + 0x28));
    MStack_80 = MOJOSHADER_IR_BINOP_OR;
    break;
  case 0x1d:
    iVar6 = 1;
    goto LAB_0012fbdc;
  case 0x1e:
    iVar6 = 0;
LAB_0012fbdc:
    pMVar15 = build_ir_logical_and_or(ctx,(MOJOSHADER_astExpressionBinary *)_ast,iVar6);
    return pMVar15;
  case 0x1f:
    pMVar15 = build_ir_expr(ctx,*(void **)((long)_ast + 0x20));
    pMVar16 = build_ir_expr(ctx,*(MOJOSHADER_astExpression **)((long)_ast + 0x28));
    MVar28 = (pMVar15->info).type;
    iVar6 = (pMVar15->info).elements;
    iVar7 = ctx->ir_temp_count;
    ctx->ir_temp_count = iVar7 + 1;
    if (MVar28 != (pMVar16->info).type) {
      __assert_fail("type == rvalue->info.type",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/andburn[P]mojoshader/mojoshader_compiler.c"
                    ,0x1523,
                    "MOJOSHADER_irExpression *build_ir_assign(Context *, const MOJOSHADER_astExpressionBinary *)"
                   );
    }
    if (iVar6 != (pMVar16->info).elements) {
      __assert_fail("elems == rvalue->info.elements",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/andburn[P]mojoshader/mojoshader_compiler.c"
                    ,0x1524,
                    "MOJOSHADER_irExpression *build_ir_assign(Context *, const MOJOSHADER_astExpressionBinary *)"
                   );
    }
    iVar25 = iVar6;
    pMVar10 = new_ir_temp(ctx,iVar7,MVar28,iVar6);
    pMVar17 = new_ir_move(ctx,pMVar10,pMVar16,iVar25);
    iVar25 = iVar6;
    pMVar16 = new_ir_temp(ctx,iVar7,MVar28,iVar6);
    pMVar22 = new_ir_move(ctx,pMVar15,pMVar16,iVar25);
    pMVar17 = new_ir_seq(ctx,pMVar17,pMVar22);
    pMVar15 = new_ir_temp(ctx,iVar7,MVar28,iVar6);
LAB_0012fd77:
    pMVar15 = new_ir_eseq(ctx,pMVar17,pMVar15);
    return pMVar15;
  case 0x20:
    MStack_80 = MOJOSHADER_IR_BINOP_MULTIPLY;
    goto LAB_0012fc2f;
  case 0x21:
    MStack_80 = MOJOSHADER_IR_BINOP_DIVIDE;
    goto LAB_0012fc2f;
  case 0x22:
    MStack_80 = MOJOSHADER_IR_BINOP_MODULO;
    goto LAB_0012fc2f;
  case 0x23:
    MStack_80 = MOJOSHADER_IR_BINOP_ADD;
    goto LAB_0012fc2f;
  case 0x24:
    MStack_80 = MOJOSHADER_IR_BINOP_SUBTRACT;
    goto LAB_0012fc2f;
  case 0x25:
    MStack_80 = MOJOSHADER_IR_BINOP_LSHIFT;
    goto LAB_0012fc2f;
  case 0x26:
    MStack_80 = MOJOSHADER_IR_BINOP_RSHIFT;
    goto LAB_0012fc2f;
  case 0x27:
    MStack_80 = MOJOSHADER_IR_BINOP_AND;
    goto LAB_0012fc2f;
  case 0x28:
    MStack_80 = MOJOSHADER_IR_BINOP_XOR;
    goto LAB_0012fc2f;
  case 0x29:
    MStack_80 = MOJOSHADER_IR_BINOP_OR;
LAB_0012fc2f:
    pMVar15 = build_ir_assign_binop(ctx,MStack_80,(MOJOSHADER_astExpressionBinary *)_ast);
    return pMVar15;
  case 0x2a:
    pMVar13 = reduce_datatype(ctx,*(MOJOSHADER_astDataType **)
                                   &((MOJOSHADER_astDataTypeFunction *)_ast)->num_params);
    pMVar14 = datatype_base(ctx,pMVar13);
    MVar28 = pMVar14->type;
    iVar6 = datatype_elems(ctx,pMVar13);
    pMVar15 = build_ir_expr(ctx,*(void **)((long)_ast + 0x20));
    pMVar16 = build_ir_expr(ctx,*(MOJOSHADER_astExpression **)((long)_ast + 0x28));
    puVar11 = (undefined4 *)Malloc(ctx,0x30);
    if (puVar11 == (undefined4 *)0x0) {
      return (void *)0x0;
    }
    *puVar11 = 7;
    *(char **)(puVar11 + 2) = ctx->sourcefile;
    puVar11[4] = ctx->sourceline;
    puVar11[6] = MVar28;
    puVar11[7] = iVar6;
    *(MOJOSHADER_irExpression **)(puVar11 + 8) = pMVar15;
    *(MOJOSHADER_irExpression **)(puVar11 + 10) = pMVar16;
    return puVar11;
  case 0x2d:
    if (**(int **)((long)*(void **)((long)_ast + 0x20) + 0x18) != 1) {
      __assert_fail("ast->binary.left->datatype->type == MOJOSHADER_AST_DATATYPE_BOOL",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/andburn[P]mojoshader/mojoshader_compiler.c"
                    ,0x1593,"void *build_ir_internal(Context *, void *)");
    }
    pMVar15 = build_ir_expr(ctx,*(void **)((long)_ast + 0x20));
    pMVar16 = new_ir_constbool(ctx,1);
    pMVar10 = build_ir_expr(ctx,*(MOJOSHADER_astExpression **)((long)_ast + 0x28));
    fval = build_ir_expr(ctx,*(void **)&((MOJOSHADER_astExpressionBinary *)((long)_ast + 0x30))->ast
                        );
    MStack_80 = MOJOSHADER_IR_COND_EQL;
LAB_0012fb53:
    pMVar15 = build_ir_compare(ctx,MStack_80,pMVar15,pMVar16,pMVar10,fval);
    return pMVar15;
  case 0x30:
    pMVar13 = reduce_datatype(ctx,*(MOJOSHADER_astDataType **)
                                   &((MOJOSHADER_astDataTypeFunction *)_ast)->num_params);
    pMVar14 = datatype_base(ctx,pMVar13);
    MVar28 = pMVar14->type;
    iVar6 = datatype_elems(ctx,pMVar13);
    pMVar15 = new_ir_memory(ctx,*(int *)((long)_ast + 0x28),MVar28,iVar6);
    return pMVar15;
  case 0x31:
    pMVar15 = new_ir_constint(ctx,((MOJOSHADER_astDataType *)((long)_ast + 0x20))->type);
    return pMVar15;
  case 0x32:
    dVar1 = *(double *)((long)_ast + 0x20);
    puVar11 = (undefined4 *)Malloc(ctx,0x60);
    if (puVar11 == (undefined4 *)0x0) {
      return (void *)0x0;
    }
    *puVar11 = 1;
    *(char **)(puVar11 + 2) = ctx->sourcefile;
    puVar11[4] = ctx->sourceline;
    *(undefined8 *)(puVar11 + 6) = 0x100000004;
    puVar11[8] = (float)dVar1;
    return puVar11;
  case 0x33:
  case 0x3d:
  case 0x3e:
  case 0x3f:
  case 0x40:
  case 0x54:
  case 0x55:
  case 0x56:
  case 0x57:
  case 0x58:
  case 0x59:
  case 0x5a:
  case 0x5b:
  case 0x5c:
  case 0x5d:
  case 0x5e:
  case 0x5f:
    __assert_fail("0 && \"Shouldn\'t hit this in build_ir.\"",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/andburn[P]mojoshader/mojoshader_compiler.c"
                  ,0x1603,"void *build_ir_internal(Context *, void *)");
  case 0x34:
    pMVar15 = new_ir_constbool(ctx,((MOJOSHADER_astDataType *)((long)_ast + 0x20))->type);
    return pMVar15;
  case 0x37:
    MVar3 = (((MOJOSHADER_astExpressionBinary *)((long)_ast + 0x30))->ast).type;
    pMVar13 = reduce_datatype(ctx,*(MOJOSHADER_astDataType **)
                                   &((MOJOSHADER_astDataTypeFunction *)_ast)->num_params);
    pMVar14 = datatype_base(ctx,pMVar13);
    MVar28 = pMVar14->type;
    iVar6 = datatype_elems(ctx,pMVar13);
    if (MVar3 == MOJOSHADER_AST_OP_START_RANGE) {
      pMVar15 = build_ir_expr(ctx,*(void **)((long)_ast + 0x20));
      if (pMVar15 == (MOJOSHADER_irExpression *)0x0) {
        return (void *)0x0;
      }
      pMVar16 = pMVar15;
      if ((((MOJOSHADER_astExpressionBinary *)((long)_ast + 0x30))->ast).type ==
          MOJOSHADER_AST_OP_START_RANGE) {
        for (; MVar5 = (pMVar16->ir).type, MVar5 == MOJOSHADER_IR_ESEQ;
            pMVar16 = (pMVar16->binop).left) {
        }
        if ((MVar5 != MOJOSHADER_IR_TEMP) && (MVar5 != MOJOSHADER_IR_MEMORY)) {
          __assert_fail("0 && \"Unexpected condition\"",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/andburn[P]mojoshader/mojoshader_compiler.c"
                        ,0x14de,
                        "MOJOSHADER_irExpression *build_ir_derefstruct(Context *, const MOJOSHADER_astExpressionDerefStruct *)"
                       );
        }
        (pMVar16->temp).index = (pMVar16->temp).index + *(int *)((long)_ast + 0x34);
        (pMVar15->info).type = MVar28;
        (pMVar15->info).elements = iVar6;
        return pMVar15;
      }
      __assert_fail("!ast->isswizzle",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/andburn[P]mojoshader/mojoshader_compiler.c"
                    ,0x14d4,
                    "MOJOSHADER_irExpression *build_ir_derefstruct(Context *, const MOJOSHADER_astExpressionDerefStruct *)"
                   );
    }
    local_54 = 0;
    pMVar27 = *(MOJOSHADER_astExpression **)((long)_ast + 0x28);
    lVar23 = 0;
    goto LAB_0012f630;
  case 0x38:
    pMVar13 = reduce_datatype(ctx,*(MOJOSHADER_astDataType **)
                                   &((MOJOSHADER_astDataTypeFunction *)_ast)->num_params);
    pMVar14 = datatype_base(ctx,pMVar13);
    MVar28 = pMVar14->type;
    iVar6 = datatype_elems(ctx,pMVar13);
    uVar4 = *(undefined4 *)(*(long *)((long)_ast + 0x20) + 0x28);
    pMVar12 = build_ir_exprlist(ctx,*(MOJOSHADER_astArguments **)((long)_ast + 0x28));
    puVar11 = (undefined4 *)Malloc(ctx,0x30);
    if (puVar11 == (undefined4 *)0x0) {
      return (void *)0x0;
    }
    *puVar11 = 5;
    *(char **)(puVar11 + 2) = ctx->sourcefile;
    puVar11[4] = ctx->sourceline;
    puVar11[6] = MVar28;
    puVar11[7] = iVar6;
    *(MOJOSHADER_irExprList **)(puVar11 + 10) = pMVar12;
    puVar11[8] = uVar4;
    return puVar11;
  case 0x39:
    pMVar13 = reduce_datatype(ctx,*(MOJOSHADER_astDataType **)
                                   &((MOJOSHADER_astDataTypeFunction *)_ast)->num_params);
    pMVar14 = datatype_base(ctx,pMVar13);
    MVar28 = pMVar14->type;
    iVar6 = datatype_elems(ctx,pMVar13);
    if (0x10 < iVar6) {
      __assert_fail("elems <= 16",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/andburn[P]mojoshader/mojoshader_compiler.c"
                    ,0x1498,
                    "MOJOSHADER_irExpression *build_ir_constructor(Context *, const MOJOSHADER_astExpressionConstructor *)"
                   );
    }
    pMVar15 = (MOJOSHADER_irExpression *)
              build_ir_exprlist(ctx,*(MOJOSHADER_astArguments **)((long)_ast + 0x20));
    puVar11 = (undefined4 *)Malloc(ctx,0x28);
    if (puVar11 == (undefined4 *)0x0) {
      return (void *)0x0;
    }
    *puVar11 = 10;
LAB_0012fca4:
    *(char **)(puVar11 + 2) = ctx->sourcefile;
    puVar11[4] = ctx->sourceline;
    puVar11[6] = MVar28;
    puVar11[7] = iVar6;
    *(MOJOSHADER_irExpression **)(puVar11 + 8) = pMVar15;
    return puVar11;
  case 0x43:
  case 0x4f:
  case 0x50:
  case 0x51:
    goto switchD_0012f18c_caseD_43;
  case 0x44:
    if (ctx->ir_loop == (LoopLabels *)0x0) {
      __assert_fail("labels != NULL",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/andburn[P]mojoshader/mojoshader_compiler.c"
                    ,0x15b2,"void *build_ir_internal(Context *, void *)");
    }
    iVar6 = ctx->ir_loop->end;
    goto LAB_0012fed3;
  case 0x45:
    if (ctx->ir_loop == (LoopLabels *)0x0) {
      __assert_fail("labels != NULL",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/andburn[P]mojoshader/mojoshader_compiler.c"
                    ,0x15b9,"void *build_ir_internal(Context *, void *)");
    }
    iVar6 = ctx->ir_loop->start;
LAB_0012fed3:
    pMVar17 = new_ir_jump(ctx,iVar6);
    return pMVar17;
  case 0x46:
    pMVar17 = (MOJOSHADER_irStatement *)Malloc(ctx,0x18);
    if (pMVar17 != (MOJOSHADER_irStatement *)0x0) {
      (pMVar17->ir).type = MOJOSHADER_IR_DISCARD;
      (pMVar17->ir).filename = ctx->sourcefile;
      (pMVar17->ir).line = ctx->sourceline;
    }
    goto LAB_001301c6;
  case 0x47:
    pMVar17 = build_ir_stmt(ctx,*(void **)((long)_ast + 0x20));
    goto LAB_001301c6;
  case 0x48:
    pMVar15 = build_ir_expr(ctx,*(void **)((long)_ast + 0x20));
    pMVar17 = new_ir_expr_stmt(ctx,pMVar15);
    goto LAB_001301c6;
  case 0x49:
    pMVar27 = *(MOJOSHADER_astExpression **)((long)_ast + 0x28);
    if (pMVar27->datatype->type != MOJOSHADER_AST_DATATYPE_BOOL) {
      __assert_fail("ast->expr->datatype->type == MOJOSHADER_AST_DATATYPE_BOOL",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/andburn[P]mojoshader/mojoshader_compiler.c"
                    ,0x133f,
                    "MOJOSHADER_irStatement *build_ir_ifstmt(Context *, const MOJOSHADER_astIfStatement *)"
                   );
    }
    iVar25 = ctx->ir_label_count;
    iVar6 = iVar25 + 1;
    iVar7 = iVar25 + 2;
    if (*(char **)((long)_ast + 0x38) == (char *)0x0) {
      ctx->ir_label_count = iVar7;
      pMVar15 = build_ir_expr(ctx,pMVar27);
      pMVar16 = new_ir_constbool(ctx,1);
      pMVar17 = new_ir_cjump(ctx,MOJOSHADER_IR_COND_EQL,pMVar15,pMVar16,iVar25,iVar6);
      pMVar22 = new_ir_label(ctx,iVar25);
      pMVar19 = build_ir_stmt(ctx,*(void **)&((MOJOSHADER_astExpressionBinary *)((long)_ast + 0x30))
                                             ->ast);
      pMVar20 = new_ir_label(ctx,iVar6);
      pMVar21 = build_ir_stmt(ctx,*(MOJOSHADER_astDataType **)((long)_ast + 0x18));
      pMVar20 = new_ir_seq(ctx,pMVar20,pMVar21);
      pMVar19 = new_ir_seq(ctx,pMVar19,pMVar20);
      pMVar22 = new_ir_seq(ctx,pMVar22,pMVar19);
    }
    else {
      ctx->ir_label_count = iVar25 + 3;
      pMVar15 = build_ir_expr(ctx,pMVar27);
      pMVar16 = new_ir_constbool(ctx,1);
      pMVar17 = new_ir_cjump(ctx,MOJOSHADER_IR_COND_EQL,pMVar15,pMVar16,iVar25,iVar6);
      pMVar22 = new_ir_label(ctx,iVar25);
      pMVar19 = build_ir_stmt(ctx,*(void **)&((MOJOSHADER_astExpressionBinary *)((long)_ast + 0x30))
                                             ->ast);
      pMVar20 = new_ir_jump(ctx,iVar7);
      pMVar21 = new_ir_label(ctx,iVar6);
      pMVar8 = build_ir_stmt(ctx,*(char **)((long)_ast + 0x38));
      pMVar9 = new_ir_label(ctx,iVar7);
      next = build_ir_stmt(ctx,*(MOJOSHADER_astDataType **)((long)_ast + 0x18));
      pMVar9 = new_ir_seq(ctx,pMVar9,next);
      pMVar8 = new_ir_seq(ctx,pMVar8,pMVar9);
      pMVar21 = new_ir_seq(ctx,pMVar21,pMVar8);
      pMVar20 = new_ir_seq(ctx,pMVar20,pMVar21);
      pMVar19 = new_ir_seq(ctx,pMVar19,pMVar20);
      pMVar22 = new_ir_seq(ctx,pMVar22,pMVar19);
    }
    goto LAB_001301d8;
  case 0x4a:
    pLVar18 = push_ir_loop(ctx,1);
    if (pLVar18 == (LoopLabels *)0x0) {
      return (void *)0x0;
    }
    local_50 = (MOJOSHADER_irStatement *)CONCAT44(local_50._4_4_,pLVar18->end);
    iVar7 = datatype_elems(ctx,(*(MOJOSHADER_astExpression **)((long)_ast + 0x28))->datatype);
    pMVar13 = datatype_base(ctx,(*(MOJOSHADER_astExpression **)((long)_ast + 0x28))->datatype);
    local_44 = pMVar13->type;
    lVar23 = *(long *)&((MOJOSHADER_astExpressionBinary *)((long)_ast + 0x30))->ast;
    index = ctx->ir_temp_count;
    local_38 = (ulong)index;
    ctx->ir_temp_count = index + 1;
    iVar6 = iVar7;
    pMVar15 = new_ir_temp(ctx,index,local_44,iVar7);
    pMVar16 = build_ir_expr(ctx,*(MOJOSHADER_astExpression **)((long)_ast + 0x28));
    pMVar22 = new_ir_move(ctx,pMVar15,pMVar16,iVar6);
    pMVar17 = (MOJOSHADER_irStatement *)0x0;
    pMVar19 = (MOJOSHADER_irStatement *)0x0;
    local_40 = pMVar22;
    for (; lVar23 != 0; lVar23 = *(long *)(lVar23 + 0x28)) {
      iVar6 = ctx->ir_label_count;
      ctx->ir_label_count = iVar6 + 1;
      iVar25 = (int)local_50;
      if (*(long *)(lVar23 + 0x28) != 0) {
        ctx->ir_label_count = iVar6 + 2;
        iVar25 = iVar6 + 1;
      }
      pMVar15 = build_ir_expr(ctx,*(void **)(lVar23 + 0x18));
      pMVar16 = new_ir_temp(ctx,(int)local_38,local_44,iVar7);
      pMVar20 = new_ir_cjump(ctx,MOJOSHADER_IR_COND_EQL,pMVar15,pMVar16,iVar6,iVar25);
      if (*(long *)(lVar23 + 0x28) == 0) {
        pMVar22 = new_ir_seq(ctx,pMVar22,pMVar20);
        pMVar20 = new_ir_label(ctx,iVar6);
        pMVar21 = build_ir_stmt(ctx,*(void **)(lVar23 + 0x20));
        pMVar20 = new_ir_seq(ctx,pMVar20,pMVar21);
        pMVar19 = new_ir_seq(ctx,pMVar19,pMVar20);
        pMVar20 = new_ir_label(ctx,iVar25);
      }
      else {
        pMVar21 = new_ir_label(ctx,iVar25);
        pMVar20 = new_ir_seq(ctx,pMVar20,pMVar21);
        pMVar22 = new_ir_seq(ctx,pMVar22,pMVar20);
        pMVar20 = new_ir_label(ctx,iVar6);
        pMVar21 = build_ir_stmt(ctx,*(void **)(lVar23 + 0x20));
        pMVar20 = new_ir_seq(ctx,pMVar20,pMVar21);
      }
      pMVar19 = new_ir_seq(ctx,pMVar19,pMVar20);
      if (pMVar17 == (MOJOSHADER_irStatement *)0x0) {
        pMVar17 = pMVar19;
      }
    }
    pop_ir_loop(ctx);
    pMVar22 = build_ir_stmt(ctx,*(MOJOSHADER_astDataType **)((long)_ast + 0x18));
    pMVar22 = new_ir_seq(ctx,pMVar17,pMVar22);
    pMVar17 = local_40;
LAB_001301d8:
    pMVar17 = new_ir_seq(ctx,pMVar17,pMVar22);
    return pMVar17;
  case 0x4b:
    if (**(int **)(*(char **)((long)_ast + 0x38) + 0x18) != 1) {
      __assert_fail("ast->looptest->datatype->type == MOJOSHADER_AST_DATATYPE_BOOL",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/andburn[P]mojoshader/mojoshader_compiler.c"
                    ,0x1376,
                    "MOJOSHADER_irStatement *build_ir_forstmt(Context *, const MOJOSHADER_astForStatement *)"
                   );
    }
    iVar6 = ctx->ir_label_count;
    ctx->ir_label_count = iVar6 + 2;
    pLVar18 = push_ir_loop(ctx,0);
    if (pLVar18 == (LoopLabels *)0x0) {
      return (void *)0x0;
    }
    if ((*(long *)&((MOJOSHADER_astExpressionBinary *)((long)_ast + 0x30))->ast == 0) ==
        (*(MOJOSHADER_astExpression **)((long)_ast + 0x28) == (MOJOSHADER_astExpression *)0x0)) {
      __assert_fail("(ast->var_decl && !ast->initializer) || (!ast->var_decl && ast->initializer)",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/andburn[P]mojoshader/mojoshader_compiler.c"
                    ,0x138f,
                    "MOJOSHADER_irStatement *build_ir_forstmt(Context *, const MOJOSHADER_astForStatement *)"
                   );
    }
    iVar7 = pLVar18->start;
    iVar25 = pLVar18->end;
    pMVar17 = new_ir_label(ctx,iVar6);
    pMVar15 = build_ir_expr(ctx,*(char **)((long)_ast + 0x38));
    pMVar16 = new_ir_constbool(ctx,1);
    pMVar22 = new_ir_cjump(ctx,MOJOSHADER_IR_COND_EQL,pMVar15,pMVar16,iVar6 + 1,iVar25);
    pMVar19 = new_ir_label(ctx,iVar6 + 1);
    local_50 = build_ir_stmt(ctx,*(MOJOSHADER_astDataType **)((long)_ast + 0x48));
    pMVar20 = new_ir_label(ctx,iVar7);
    pMVar15 = build_ir_expr(ctx,*(void **)((long)_ast + 0x40));
    pMVar21 = new_ir_expr_stmt(ctx,pMVar15);
    pMVar8 = new_ir_jump(ctx,iVar6);
    pMVar9 = new_ir_label(ctx,iVar25);
    pMVar8 = new_ir_seq(ctx,pMVar8,pMVar9);
    pMVar21 = new_ir_seq(ctx,pMVar21,pMVar8);
    pMVar20 = new_ir_seq(ctx,pMVar20,pMVar21);
    pMVar20 = new_ir_seq(ctx,local_50,pMVar20);
    pMVar19 = new_ir_seq(ctx,pMVar19,pMVar20);
    pMVar22 = new_ir_seq(ctx,pMVar22,pMVar19);
    pMVar17 = new_ir_seq(ctx,pMVar17,pMVar22);
    local_78 = (MOJOSHADER_irStatement *)0x0;
    goto LAB_001301b3;
  case 0x4c:
    if ((*(MOJOSHADER_astExpression **)((long)_ast + 0x28))->datatype->type !=
        MOJOSHADER_AST_DATATYPE_BOOL) {
      __assert_fail("ast->expr->datatype->type == MOJOSHADER_AST_DATATYPE_BOOL",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/andburn[P]mojoshader/mojoshader_compiler.c"
                    ,0x13d9,
                    "MOJOSHADER_irStatement *build_ir_dostmt(Context *, const MOJOSHADER_astDoStatement *)"
                   );
    }
    pLVar18 = push_ir_loop(ctx,0);
    if (pLVar18 == (LoopLabels *)0x0) {
      return (void *)0x0;
    }
    iVar6 = pLVar18->start;
    iVar7 = pLVar18->end;
    local_78 = new_ir_label(ctx,iVar6);
    pMVar17 = build_ir_stmt(ctx,*(void **)&((MOJOSHADER_astExpressionBinary *)((long)_ast + 0x30))->
                                           ast);
    pMVar15 = build_ir_expr(ctx,*(MOJOSHADER_astExpression **)((long)_ast + 0x28));
    pMVar16 = new_ir_constbool(ctx,1);
    pMVar22 = new_ir_cjump(ctx,MOJOSHADER_IR_COND_EQL,pMVar15,pMVar16,iVar6,iVar7);
    pMVar19 = new_ir_label(ctx,iVar7);
    pMVar22 = new_ir_seq(ctx,pMVar22,pMVar19);
    goto LAB_001301a4;
  case 0x4d:
    if ((*(MOJOSHADER_astExpression **)((long)_ast + 0x28))->datatype->type !=
        MOJOSHADER_AST_DATATYPE_BOOL) {
      __assert_fail("ast->expr->datatype->type == MOJOSHADER_AST_DATATYPE_BOOL",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/andburn[P]mojoshader/mojoshader_compiler.c"
                    ,0x13b4,
                    "MOJOSHADER_irStatement *build_ir_whilestmt(Context *, const MOJOSHADER_astWhileStatement *)"
                   );
    }
    pLVar18 = push_ir_loop(ctx,0);
    if (pLVar18 == (LoopLabels *)0x0) {
      return (void *)0x0;
    }
    iVar6 = pLVar18->start;
    iVar7 = ctx->ir_label_count;
    ctx->ir_label_count = iVar7 + 1;
    iVar25 = pLVar18->end;
    local_78 = new_ir_label(ctx,iVar6);
    pMVar15 = build_ir_expr(ctx,*(MOJOSHADER_astExpression **)((long)_ast + 0x28));
    pMVar16 = new_ir_constbool(ctx,1);
    pMVar17 = new_ir_cjump(ctx,MOJOSHADER_IR_COND_EQL,pMVar15,pMVar16,iVar7,iVar25);
    pMVar22 = new_ir_label(ctx,iVar7);
    pMVar19 = build_ir_stmt(ctx,*(void **)&((MOJOSHADER_astExpressionBinary *)((long)_ast + 0x30))->
                                           ast);
    pMVar20 = new_ir_jump(ctx,iVar6);
    pMVar21 = new_ir_label(ctx,iVar25);
    pMVar20 = new_ir_seq(ctx,pMVar20,pMVar21);
    pMVar19 = new_ir_seq(ctx,pMVar19,pMVar20);
    pMVar22 = new_ir_seq(ctx,pMVar22,pMVar19);
LAB_001301a4:
    pMVar17 = new_ir_seq(ctx,pMVar17,pMVar22);
LAB_001301b3:
    pMVar17 = new_ir_seq(ctx,local_78,pMVar17);
    pop_ir_loop(ctx);
LAB_001301c6:
    pMVar22 = build_ir_stmt(ctx,*(MOJOSHADER_astDataType **)((long)_ast + 0x18));
    goto LAB_001301d8;
  case 0x4e:
    iVar6 = ctx->ir_end;
    if (iVar6 < 0) {
      __assert_fail("label >= 0",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/andburn[P]mojoshader/mojoshader_compiler.c"
                    ,0x15e4,"void *build_ir_internal(Context *, void *)");
    }
    if (*(long *)((long)_ast + 0x20) == 0) {
      pMVar17 = (MOJOSHADER_irStatement *)0x0;
    }
    else {
      pMVar13 = reduce_datatype(ctx,*(MOJOSHADER_astDataType **)
                                     (*(long *)((long)_ast + 0x20) + 0x18));
      pMVar14 = datatype_base(ctx,pMVar13);
      MVar28 = pMVar14->type;
      iVar7 = datatype_elems(ctx,pMVar13);
      if (ctx->ir_ret < 0) {
        __assert_fail("ctx->ir_ret >= 0",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/andburn[P]mojoshader/mojoshader_compiler.c"
                      ,0x15ec,"void *build_ir_internal(Context *, void *)");
      }
      pMVar15 = new_ir_temp(ctx,ctx->ir_ret,MVar28,iVar7);
      pMVar16 = build_ir_expr(ctx,*(void **)((long)_ast + 0x20));
      pMVar17 = new_ir_move(ctx,pMVar15,pMVar16,iVar7);
    }
    pMVar22 = new_ir_jump(ctx,iVar6);
    goto LAB_001301d8;
  }
  pMVar15 = new_ir_binop(ctx,MStack_80,pMVar15,pMVar16);
  return pMVar15;
switchD_0012f18c_caseD_43:
  _ast = *(void **)&((MOJOSHADER_astDataTypeFunction *)_ast)->num_params;
  goto LAB_0012f154;
LAB_0012f630:
  cVar2 = *(char *)((long)&(pMVar27->ast).type + lVar23);
  switch(cVar2) {
  case 'r':
  case 'x':
    uVar26 = 0;
    break;
  case 's':
  case 't':
  case 'u':
  case 'v':
switchD_0012f643_caseD_73:
    __assert_fail("0 && \"Should have been caught by semantic analysis.\"",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/andburn[P]mojoshader/mojoshader_compiler.c"
                  ,0x14aa,"char swiz_to_channel(const char)");
  case 'w':
    goto switchD_0012f643_caseD_77;
  case 'y':
switchD_0012f643_caseD_79:
    uVar26 = 1;
    break;
  case 'z':
switchD_0012f643_caseD_7a:
    uVar26 = 2;
    break;
  default:
    if (cVar2 != 'a') {
      if (cVar2 == 'b') goto switchD_0012f643_caseD_7a;
      if (cVar2 == 'g') goto switchD_0012f643_caseD_79;
      if (cVar2 == '\0') {
        pMVar15 = build_ir_expr(ctx,*(void **)((long)_ast + 0x20));
        puVar11 = (undefined4 *)Malloc(ctx,0x30);
        if (puVar11 != (undefined4 *)0x0) {
          *puVar11 = 9;
          *(char **)(puVar11 + 2) = ctx->sourcefile;
          puVar11[4] = ctx->sourceline;
          puVar11[6] = MVar28;
          puVar11[7] = iVar6;
          *(MOJOSHADER_irExpression **)(puVar11 + 8) = pMVar15;
          puVar11[10] = local_54;
        }
        return puVar11;
      }
      goto switchD_0012f643_caseD_73;
    }
switchD_0012f643_caseD_77:
    uVar26 = 3;
  }
  *(undefined1 *)((long)&local_54 + lVar23) = uVar26;
  lVar23 = lVar23 + 1;
  goto LAB_0012f630;
}

Assistant:

static void *build_ir_internal(Context *ctx, void *_ast)
{
    if ((_ast == NULL) || (ctx->out_of_memory))
        return NULL;

    MOJOSHADER_astNode *ast = (MOJOSHADER_astNode *) _ast;

    // upkeep so we report correct error locations...
    ctx->sourcefile = ast->ast.filename;
    ctx->sourceline = ast->ast.line;

    switch (ast->ast.type)
    {
        case MOJOSHADER_AST_OP_PREINCREMENT:  // !!! FIXME: sequence points?
            return build_ir_preincdec(ctx, &ast->unary, MOJOSHADER_IR_BINOP_ADD);

        case MOJOSHADER_AST_OP_POSTINCREMENT: // !!! FIXME: sequence points?
            return build_ir_postincdec(ctx, &ast->unary, MOJOSHADER_IR_BINOP_ADD);

        case MOJOSHADER_AST_OP_PREDECREMENT:  // !!! FIXME: sequence points?
            return build_ir_preincdec(ctx, &ast->unary, MOJOSHADER_IR_BINOP_SUBTRACT);

        case MOJOSHADER_AST_OP_POSTDECREMENT: // !!! FIXME: sequence points?
            return build_ir_postincdec(ctx, &ast->unary, MOJOSHADER_IR_BINOP_SUBTRACT);

        case MOJOSHADER_AST_OP_COMPLEMENT:
            return NEW_IR_BINOP(XOR, build_ir_expr(ctx, ast->unary.operand),
                                new_ir_constint(ctx, 0xFFFFFFFF));

        case MOJOSHADER_AST_OP_NEGATE:  // !!! FIXME: -0.0f != +0.0f
            return NEW_IR_BINOP(SUBTRACT, build_ir_increxpr(ctx, ast->unary.datatype, -1),
                                build_ir_expr(ctx, ast->unary.operand));

        case MOJOSHADER_AST_OP_NOT:  // operand must be bool here!
            assert(ast->unary.operand->datatype->type == MOJOSHADER_AST_DATATYPE_BOOL);
            return NEW_IR_BINOP(XOR, build_ir_expr(ctx, ast->unary.operand),
                                new_ir_constint(ctx, 1));

        case MOJOSHADER_AST_OP_DEREF_ARRAY:
            return build_ir_derefarray(ctx, &ast->binary);

        case MOJOSHADER_AST_OP_DEREF_STRUCT:
            if (ast->derefstruct.isswizzle)
                return build_ir_swizzle(ctx, &ast->derefstruct);
            return build_ir_derefstruct(ctx, &ast->derefstruct);

        case MOJOSHADER_AST_OP_COMMA:
            // evaluate and throw away left, return right.
            return new_ir_eseq(ctx, new_ir_expr_stmt(ctx, build_ir_expr(ctx, ast->binary.left)),
                               build_ir_expr(ctx, ast->binary.right));

        case MOJOSHADER_AST_OP_LESSTHAN: return EASY_IR_COMPARE(LT);
        case MOJOSHADER_AST_OP_GREATERTHAN: return EASY_IR_COMPARE(GT);
        case MOJOSHADER_AST_OP_LESSTHANOREQUAL: return EASY_IR_COMPARE(LEQ);
        case MOJOSHADER_AST_OP_GREATERTHANOREQUAL: return EASY_IR_COMPARE(GEQ);
        case MOJOSHADER_AST_OP_NOTEQUAL: return EASY_IR_COMPARE(NEQ);
        case MOJOSHADER_AST_OP_EQUAL: return EASY_IR_COMPARE(EQL);

        case MOJOSHADER_AST_OP_MULTIPLY: return EASY_IR_BINOP(MULTIPLY);
        case MOJOSHADER_AST_OP_DIVIDE: return EASY_IR_BINOP(DIVIDE);
        case MOJOSHADER_AST_OP_MODULO: return EASY_IR_BINOP(MODULO);
        case MOJOSHADER_AST_OP_ADD: return EASY_IR_BINOP(ADD);
        case MOJOSHADER_AST_OP_SUBTRACT: return EASY_IR_BINOP(SUBTRACT);
        case MOJOSHADER_AST_OP_LSHIFT: return EASY_IR_BINOP(LSHIFT);
        case MOJOSHADER_AST_OP_RSHIFT: return EASY_IR_BINOP(RSHIFT);
        case MOJOSHADER_AST_OP_BINARYAND: return EASY_IR_BINOP(AND);
        case MOJOSHADER_AST_OP_BINARYXOR: return EASY_IR_BINOP(XOR);
        case MOJOSHADER_AST_OP_BINARYOR: return EASY_IR_BINOP(OR);

        case MOJOSHADER_AST_OP_LOGICALAND:
            return build_ir_logical_and(ctx, &ast->binary);

        case MOJOSHADER_AST_OP_LOGICALOR:
            return build_ir_logical_or(ctx, &ast->binary);

        case MOJOSHADER_AST_OP_ASSIGN:
            return build_ir_assign(ctx, &ast->binary);

        case MOJOSHADER_AST_OP_MULASSIGN: return build_ir_assign_binop(ctx, MOJOSHADER_IR_BINOP_MULTIPLY, &ast->binary);
        case MOJOSHADER_AST_OP_DIVASSIGN: return build_ir_assign_binop(ctx, MOJOSHADER_IR_BINOP_DIVIDE, &ast->binary);
        case MOJOSHADER_AST_OP_MODASSIGN: return build_ir_assign_binop(ctx, MOJOSHADER_IR_BINOP_MODULO, &ast->binary);
        case MOJOSHADER_AST_OP_ADDASSIGN: return build_ir_assign_binop(ctx, MOJOSHADER_IR_BINOP_ADD, &ast->binary);
        case MOJOSHADER_AST_OP_SUBASSIGN: return build_ir_assign_binop(ctx, MOJOSHADER_IR_BINOP_SUBTRACT, &ast->binary);
        case MOJOSHADER_AST_OP_LSHIFTASSIGN: return build_ir_assign_binop(ctx, MOJOSHADER_IR_BINOP_LSHIFT, &ast->binary);
        case MOJOSHADER_AST_OP_RSHIFTASSIGN: return build_ir_assign_binop(ctx, MOJOSHADER_IR_BINOP_RSHIFT, &ast->binary);
        case MOJOSHADER_AST_OP_ANDASSIGN: return build_ir_assign_binop(ctx, MOJOSHADER_IR_BINOP_AND, &ast->binary);
        case MOJOSHADER_AST_OP_XORASSIGN: return build_ir_assign_binop(ctx, MOJOSHADER_IR_BINOP_XOR, &ast->binary);
        case MOJOSHADER_AST_OP_ORASSIGN: return build_ir_assign_binop(ctx, MOJOSHADER_IR_BINOP_OR, &ast->binary);

        case MOJOSHADER_AST_OP_CONDITIONAL:
            assert(ast->binary.left->datatype->type == MOJOSHADER_AST_DATATYPE_BOOL);
            return build_ir_compare(ctx, MOJOSHADER_IR_COND_EQL,
                                  build_ir_expr(ctx, ast->ternary.left),
                                  new_ir_constbool(ctx, 1),
                                  build_ir_expr(ctx, ast->ternary.center),
                                  build_ir_expr(ctx, ast->ternary.right));

        case MOJOSHADER_AST_OP_IDENTIFIER:
            return build_ir_identifier(ctx, &ast->identifier);

        case MOJOSHADER_AST_OP_INT_LITERAL:
            return new_ir_constint(ctx, ast->intliteral.value);

        case MOJOSHADER_AST_OP_FLOAT_LITERAL:
            return new_ir_constfloat(ctx, ast->floatliteral.value);

        case MOJOSHADER_AST_OP_BOOLEAN_LITERAL:
            return new_ir_constbool(ctx, ast->boolliteral.value);

        case MOJOSHADER_AST_OP_CALLFUNC:
            return build_ir_call(ctx, &ast->callfunc);

        case MOJOSHADER_AST_OP_CONSTRUCTOR:
            return build_ir_constructor(ctx, &ast->constructor);

        case MOJOSHADER_AST_OP_CAST:
            return build_ir_convert(ctx, &ast->cast);

        case MOJOSHADER_AST_STATEMENT_BREAK:
        {
            const LoopLabels *labels = ctx->ir_loop;
            assert(labels != NULL);  // semantic analysis should catch this.
            return new_ir_jump(ctx, labels->end);
        } // case

        case MOJOSHADER_AST_STATEMENT_CONTINUE:
        {
            const LoopLabels *labels = ctx->ir_loop;
            assert(labels != NULL);  // semantic analysis should catch this.
            return new_ir_jump(ctx, labels->start);
        } // case

        case MOJOSHADER_AST_STATEMENT_DISCARD:
            return new_ir_seq(ctx, new_ir_discard(ctx), build_ir_stmt(ctx, ast->discardstmt.next));

        case MOJOSHADER_AST_STATEMENT_EMPTY:
            return build_ir(ctx, ast->stmt.next);  // skip it, do next thing.

        case MOJOSHADER_AST_STATEMENT_EXPRESSION:
            return new_ir_seq(ctx, new_ir_expr_stmt(ctx, build_ir_expr(ctx, ast->exprstmt.expr)), build_ir_stmt(ctx, ast->exprstmt.next));

        case MOJOSHADER_AST_STATEMENT_IF:
            return build_ir_ifstmt(ctx, &ast->ifstmt);

        case MOJOSHADER_AST_STATEMENT_TYPEDEF:  // ignore this, move on.
            return build_ir(ctx, ast->typedefstmt.next);

        case MOJOSHADER_AST_STATEMENT_SWITCH:
            return build_ir_switch(ctx, &ast->switchstmt);

        case MOJOSHADER_AST_STATEMENT_STRUCT:  // ignore this, move on.
            return build_ir(ctx, ast->structstmt.next);

        case MOJOSHADER_AST_STATEMENT_VARDECL: // ignore this, move on.
            return build_ir(ctx, ast->vardeclstmt.next);

        case MOJOSHADER_AST_STATEMENT_BLOCK:
            return new_ir_seq(ctx, build_ir_stmt(ctx, ast->blockstmt.statements), build_ir_stmt(ctx, ast->blockstmt.next));

        case MOJOSHADER_AST_STATEMENT_FOR:
            return build_ir_forstmt(ctx, &ast->forstmt);

        case MOJOSHADER_AST_STATEMENT_DO:
            return build_ir_dostmt(ctx, &ast->dostmt);

        case MOJOSHADER_AST_STATEMENT_WHILE:
            return build_ir_whilestmt(ctx, &ast->whilestmt);

        case MOJOSHADER_AST_STATEMENT_RETURN:
        {
            const int label = ctx->ir_end;
            assert(label >= 0);  // parser should have caught this!
            MOJOSHADER_irStatement *retval = NULL;
            if (ast->returnstmt.expr != NULL)
            {
                // !!! FIXME: whole array/struct returns need to move more into the temp.
                const MOJOSHADER_astDataType *dt = reduce_datatype(ctx, ast->returnstmt.expr->datatype);
                const MOJOSHADER_astDataTypeType type = datatype_base(ctx, dt)->type;
                const int elems = datatype_elems(ctx, dt);
                assert(ctx->ir_ret >= 0);
                retval = new_ir_move(ctx, new_ir_temp(ctx, ctx->ir_ret, type, elems), build_ir_expr(ctx, ast->returnstmt.expr), -1);
            } // if
            return new_ir_seq(ctx, retval, new_ir_jump(ctx, label));
        } // case

        case MOJOSHADER_AST_COMPUNIT_TYPEDEF:
        case MOJOSHADER_AST_COMPUNIT_STRUCT:
        case MOJOSHADER_AST_COMPUNIT_VARIABLE:
        case MOJOSHADER_AST_COMPUNIT_FUNCTION:
        case MOJOSHADER_AST_ARGUMENTS:
        case MOJOSHADER_AST_OP_STRING_LITERAL:
        case MOJOSHADER_AST_SWITCH_CASE:
        case MOJOSHADER_AST_SCALAR_OR_ARRAY:
        case MOJOSHADER_AST_TYPEDEF:
        case MOJOSHADER_AST_FUNCTION_PARAMS:
        case MOJOSHADER_AST_FUNCTION_SIGNATURE:
        case MOJOSHADER_AST_STRUCT_DECLARATION:
        case MOJOSHADER_AST_STRUCT_MEMBER:
        case MOJOSHADER_AST_VARIABLE_DECLARATION:
        case MOJOSHADER_AST_ANNOTATION:
        case MOJOSHADER_AST_PACK_OFFSET:
        case MOJOSHADER_AST_VARIABLE_LOWLEVEL:
            assert(0 && "Shouldn't hit this in build_ir.");
            return NULL;

        default:
            assert(0 && "unexpected type");
            return NULL;
    } // switch
}